

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O3

void aom_comp_avg_pred_avx2
               (uint8_t *comp_pred,uint8_t *pred,int width,int height,uint8_t *ref,int ref_stride)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  
  if (width == 8) {
    lVar3 = (long)ref_stride;
    lVar5 = 0;
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)((long)ref + lVar3 * 3);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)((long)ref + lVar3 * 2);
      auVar6 = vpunpcklqdq_avx(auVar9,auVar6);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)((long)ref + lVar3);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *(ulong *)ref;
      auVar9 = vpunpcklqdq_avx(auVar12,auVar10);
      auVar8._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar9;
      auVar8._16_16_ = ZEXT116(1) * auVar6;
      auVar8 = vpavgb_avx2(auVar8,*(undefined1 (*) [32])(pred + lVar5 * 8));
      *(undefined1 (*) [32])(comp_pred + lVar5 * 8) = auVar8;
      ref = (uint8_t *)((long)ref + (long)(ref_stride << 2));
      lVar5 = lVar5 + 4;
    } while ((int)lVar5 < height);
  }
  else if (width == 0x10) {
    lVar3 = (long)ref_stride;
    lVar5 = 0;
    iVar4 = 0;
    do {
      auVar7._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3) +
           ZEXT116(1) * *(undefined1 (*) [16])ref;
      auVar7._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3);
      auVar11._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3 * 3) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3 * 2);
      auVar11._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3 * 3);
      auVar8 = vpavgb_avx2(auVar7,*(undefined1 (*) [32])(pred + lVar5));
      auVar7 = vpavgb_avx2(auVar11,*(undefined1 (*) [32])(pred + lVar5 + 0x20));
      *(undefined1 (*) [32])(comp_pred + lVar5) = auVar8;
      *(undefined1 (*) [32])(comp_pred + lVar5 + 0x20) = auVar7;
      iVar4 = iVar4 + 4;
      ref = *(undefined1 (*) [16])ref + (ref_stride << 2);
      lVar5 = lVar5 + 0x40;
    } while (iVar4 < height);
  }
  else if (width == 0x20) {
    lVar3 = 0;
    iVar4 = 0;
    do {
      auVar8 = vpavgb_avx2(*(undefined1 (*) [32])(pred + lVar3),*(undefined1 (*) [32])ref);
      auVar7 = vpavgb_avx2(*(undefined1 (*) [32])(pred + lVar3 + 0x20),
                           *(undefined1 (*) [32])(*(undefined1 (*) [32])ref + ref_stride));
      *(undefined1 (*) [32])(comp_pred + lVar3) = auVar8;
      *(undefined1 (*) [32])(comp_pred + lVar3 + 0x20) = auVar7;
      iVar4 = iVar4 + 2;
      ref = *(undefined1 (*) [32])ref + ref_stride * 2;
      lVar3 = lVar3 + 0x40;
    } while (iVar4 < height);
  }
  else {
    if ((width & 0x3fU) != 0) {
      if (0 < height) {
        iVar4 = 0;
        do {
          if (0 < width) {
            uVar2 = 0;
            do {
              comp_pred[uVar2] = (uint8_t)((uint)pred[uVar2] + (uint)ref[uVar2] + 1 >> 1);
              uVar2 = uVar2 + 1;
            } while ((uint)width != uVar2);
          }
          comp_pred = comp_pred + width;
          pred = pred + width;
          ref = ref + ref_stride;
          iVar4 = iVar4 + 1;
        } while (iVar4 != height);
      }
      return;
    }
    lVar3 = (long)width;
    iVar4 = 1;
    if (1 < height) {
      iVar4 = height;
    }
    iVar1 = 0;
    do {
      if (0 < width) {
        lVar5 = 0;
        do {
          auVar8 = vpavgb_avx2(*(undefined1 (*) [32])(pred + lVar5),
                               *(undefined1 (*) [32])(ref + lVar5));
          auVar7 = vpavgb_avx2(*(undefined1 (*) [32])(pred + lVar5 + 0x20),
                               *(undefined1 (*) [32])(ref + lVar5 + 0x20));
          *(undefined1 (*) [32])(comp_pred + lVar5) = auVar8;
          *(undefined1 (*) [32])(comp_pred + lVar5 + 0x20) = auVar7;
          lVar5 = lVar5 + 0x40;
        } while (lVar5 < lVar3);
      }
      iVar1 = iVar1 + 1;
      pred = pred + lVar3;
      comp_pred = comp_pred + lVar3;
      ref = ref + ref_stride;
    } while (iVar1 != iVar4);
  }
  return;
}

Assistant:

void aom_comp_avg_pred_avx2(uint8_t *comp_pred, const uint8_t *pred, int width,
                            int height, const uint8_t *ref, int ref_stride) {
  int row = 0;
  if (width == 8) {
    do {
      const __m256i pred_0123 = _mm256_loadu_si256((const __m256i *)(pred));
      const __m128i ref_0 = _mm_loadl_epi64((const __m128i *)(ref));
      const __m128i ref_1 =
          _mm_loadl_epi64((const __m128i *)(ref + ref_stride));
      const __m128i ref_2 =
          _mm_loadl_epi64((const __m128i *)(ref + 2 * ref_stride));
      const __m128i ref_3 =
          _mm_loadl_epi64((const __m128i *)(ref + 3 * ref_stride));
      const __m128i ref_01 = _mm_unpacklo_epi64(ref_0, ref_1);
      const __m128i ref_23 = _mm_unpacklo_epi64(ref_2, ref_3);

      const __m256i ref_0123 =
          _mm256_inserti128_si256(_mm256_castsi128_si256(ref_01), ref_23, 1);
      const __m256i average = _mm256_avg_epu8(pred_0123, ref_0123);
      _mm256_storeu_si256((__m256i *)(comp_pred), average);

      row += 4;
      pred += 32;
      comp_pred += 32;
      ref += 4 * ref_stride;
    } while (row < height);
  } else if (width == 16) {
    do {
      const __m256i pred_0 = _mm256_loadu_si256((const __m256i *)(pred));
      const __m256i pred_1 = _mm256_loadu_si256((const __m256i *)(pred + 32));
      const __m256i tmp0 =
          _mm256_castsi128_si256(_mm_loadu_si128((const __m128i *)(ref)));
      const __m256i ref_0 = _mm256_inserti128_si256(
          tmp0, _mm_loadu_si128((const __m128i *)(ref + ref_stride)), 1);
      const __m256i tmp1 = _mm256_castsi128_si256(
          _mm_loadu_si128((const __m128i *)(ref + 2 * ref_stride)));
      const __m256i ref_1 = _mm256_inserti128_si256(
          tmp1, _mm_loadu_si128((const __m128i *)(ref + 3 * ref_stride)), 1);
      const __m256i average_0 = _mm256_avg_epu8(pred_0, ref_0);
      const __m256i average_1 = _mm256_avg_epu8(pred_1, ref_1);
      _mm256_storeu_si256((__m256i *)(comp_pred), average_0);
      _mm256_storeu_si256((__m256i *)(comp_pred + 32), average_1);

      row += 4;
      pred += 64;
      comp_pred += 64;
      ref += 4 * ref_stride;
    } while (row < height);
  } else if (width == 32) {
    do {
      const __m256i pred_0 = _mm256_loadu_si256((const __m256i *)(pred));
      const __m256i pred_1 = _mm256_loadu_si256((const __m256i *)(pred + 32));
      const __m256i ref_0 = _mm256_loadu_si256((const __m256i *)(ref));
      const __m256i ref_1 =
          _mm256_loadu_si256((const __m256i *)(ref + ref_stride));
      const __m256i average_0 = _mm256_avg_epu8(pred_0, ref_0);
      const __m256i average_1 = _mm256_avg_epu8(pred_1, ref_1);
      _mm256_storeu_si256((__m256i *)(comp_pred), average_0);
      _mm256_storeu_si256((__m256i *)(comp_pred + 32), average_1);

      row += 2;
      pred += 64;
      comp_pred += 64;
      ref += 2 * ref_stride;
    } while (row < height);
  } else if (width % 64 == 0) {
    do {
      for (int x = 0; x < width; x += 64) {
        const __m256i pred_0 = _mm256_loadu_si256((const __m256i *)(pred + x));
        const __m256i pred_1 =
            _mm256_loadu_si256((const __m256i *)(pred + x + 32));
        const __m256i ref_0 = _mm256_loadu_si256((const __m256i *)(ref + x));
        const __m256i ref_1 =
            _mm256_loadu_si256((const __m256i *)(ref + x + 32));
        const __m256i average_0 = _mm256_avg_epu8(pred_0, ref_0);
        const __m256i average_1 = _mm256_avg_epu8(pred_1, ref_1);
        _mm256_storeu_si256((__m256i *)(comp_pred + x), average_0);
        _mm256_storeu_si256((__m256i *)(comp_pred + x + 32), average_1);
      }
      row++;
      pred += width;
      comp_pred += width;
      ref += ref_stride;
    } while (row < height);
  } else {
    aom_comp_avg_pred_c(comp_pred, pred, width, height, ref, ref_stride);
  }
}